

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# molecule.cpp
# Opt level: O2

void __thiscall indigox::Molecule::RemoveBond(Molecule *this,Bond_p *b)

{
  element_type *peVar1;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  __normal_iterator<std::shared_ptr<indigox::Bond>_*,_std::vector<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>_>
  __position;
  Bond_p hit;
  __shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2> local_68;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  Bond::GetMolecule((Bond *)&local_68);
  std::__shared_ptr<indigox::Molecule,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<indigox::Molecule,void>
            ((__shared_ptr<indigox::Molecule,(__gnu_cxx::_Lock_policy)2> *)&local_58,
             (__weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<indigox::Molecule>);
  _Var2._M_pi = local_58._M_pi;
  peVar1 = local_68._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
  if (peVar1 == (element_type *)_Var2._M_pi) {
    __position = std::
                 __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<indigox::Bond>*,std::vector<std::shared_ptr<indigox::Bond>,std::allocator<std::shared_ptr<indigox::Bond>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<indigox::Bond>const>>
                           ((this->bonds_).
                            super__Vector_base<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (this->bonds_).
                            super__Vector_base<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,b);
    if (__position._M_current !=
        (this->bonds_).
        super__Vector_base<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_68,
                 &(__position._M_current)->
                  super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>);
      Bond::GetSourceAtom((Bond *)&local_58);
      _Var2._M_pi = local_58._M_pi;
      std::__shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_38,&local_68);
      Atom::RemoveBond((Atom *)_Var2._M_pi,(Bond_p *)&local_38);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
      Bond::GetTargetAtom((Bond *)&local_58);
      std::__shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_48,&local_68);
      Atom::RemoveBond((Atom *)local_58._M_pi,(Bond_p *)&local_48);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
      std::vector<std::shared_ptr<indigox::Bond>,_std::allocator<std::shared_ptr<indigox::Bond>_>_>
      ::erase(&this->bonds_,(const_iterator)__position._M_current);
      std::
      _Rb_tree<std::shared_ptr<indigox::Bond>,_std::pair<const_std::shared_ptr<indigox::Bond>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>_>,_std::_Select1st<std::pair<const_std::shared_ptr<indigox::Bond>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>_>_>,_std::less<std::shared_ptr<indigox::Bond>_>,_std::allocator<std::pair<const_std::shared_ptr<indigox::Bond>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>_>_>_>
      ::erase(&(this->bond_to_edge_)._M_t,(key_type *)&local_68);
      Bond::Clear(local_68._M_ptr);
      this->modified_ = true;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
    }
  }
  return;
}

Assistant:

void Molecule::RemoveBond(Bond_p b) {
  if (b->GetMolecule() != shared_from_this()) return;
  auto it = std::find(bonds_.begin(), bonds_.end(), b);
  if (it != bonds_.end()) {
    Bond_p hit = *it;
    hit->GetSourceAtom()->RemoveBond(hit);
    hit->GetTargetAtom()->RemoveBond(hit);
    bonds_.erase(it);
    bond_to_edge_.erase(hit);
    hit->Clear();
    modified_ = true;
  }
}